

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringalgorithms_p.h
# Opt level: O0

QString * QStringAlgorithms<const_QString>::trimmed_helper(QString *str)

{
  long lVar1;
  const_iterator pQVar2;
  QString *pQVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  TrimPositions TVar4;
  Char *begin;
  QString *in_stack_ffffffffffffffb8;
  QString *this;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  TVar4 = trimmed_helper_positions(in_RDI);
  local_18 = TVar4.begin;
  pQVar2 = QString::cbegin((QString *)0x1d888d);
  if (local_18 == pQVar2) {
    local_10 = (QString *)TVar4.end;
    pQVar3 = (QString *)QString::cend(in_RDI);
    in_stack_ffffffffffffffb8 = local_10;
    if (local_10 == pQVar3) {
      QString::QString(in_RDI,local_10);
      goto LAB_001d88e9;
    }
  }
  QString::QString(this,(QChar *)in_RDI,(qsizetype)in_stack_ffffffffffffffb8);
LAB_001d88e9:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

static inline StringType trimmed_helper(StringType &str)
    {
        const auto [begin, end] = trimmed_helper_positions(str);
        if (begin == str.cbegin() && end == str.cend())
            return str;
        if (!isConst && str.isDetached())
            return trimmed_helper_inplace(str, begin, end);
        return StringType(begin, end - begin);
    }